

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmArrayIndex(ExpressionContext *ctx,VmModule *module,ExprArrayIndex *node)

{
  VmModule *module_00;
  SynBase *source;
  VmValue *first;
  VmValue *second;
  VmConstant *pVVar1;
  TypeRef *pTVar2;
  TypeBase *pTVar3;
  VmConstant *elementSize;
  VmInstruction *unaff_R12;
  _func_int **pp_Var4;
  VmType type;
  
  first = CompileVm(ctx,module,node->value);
  second = CompileVm(ctx,module,node->index);
  pTVar3 = node->value->type;
  if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x14)) {
    pTVar3 = (TypeBase *)0x0;
  }
  if (pTVar3 != (TypeBase *)0x0) {
    pVVar1 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                               *(int *)(*(long *)&pTVar3[1].typeIndex + 0x30));
    module_00 = (VmModule *)(node->super_ExprBase).source;
    pTVar2 = ExpressionContext::GetReferenceType(ctx,*(TypeBase **)&pTVar3[1].typeIndex);
    if ((first->type).type != VM_TYPE_ARRAY_REF) {
      __assert_fail("value->type.type == VM_TYPE_ARRAY_REF",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x217,
                    "VmValue *(anonymous namespace)::CreateIndexUnsized(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                   );
    }
    if (((pVVar1->super_VmValue).type.type != VM_TYPE_INT) ||
       ((pVVar1->super_VmValue).type.size != 4)) {
      __assert_fail("elementSize->type == VmType::Int",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x218,
                    "VmValue *(anonymous namespace)::CreateIndexUnsized(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                   );
    }
    if (((second->type).type != VM_TYPE_INT) || ((second->type).size != 4)) {
      __assert_fail("index->type == VmType::Int",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x219,
                    "VmValue *(anonymous namespace)::CreateIndexUnsized(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                   );
    }
    if (pTVar2 == (TypeRef *)0x0) {
      __assert_fail("structType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                    ,0xcd,"static const VmType VmType::Pointer(TypeBase *)");
    }
    type.structType = (TypeBase *)0x17;
    type._0_8_ = pTVar2;
    unaff_R12 = anon_unknown.dwarf_233176::CreateInstruction
                          ((anon_unknown_dwarf_233176 *)module,module_00,(SynBase *)0x800000006,type
                           ,(VmInstructionType)pVVar1,first,second,(VmValue *)0x0,(VmValue *)0x0,
                           first);
    anon_unknown.dwarf_233176::CheckType(ctx,&node->super_ExprBase,&unaff_R12->super_VmValue);
  }
  if (pTVar3 == (TypeBase *)0x0) {
    pTVar3 = node->value->type;
    if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x12)) {
      pTVar3 = (TypeBase *)0x0;
    }
    if (pTVar3 == (TypeBase *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xd08,
                    "VmValue *CompileVmArrayIndex(ExpressionContext &, VmModule *, ExprArrayIndex *)"
                   );
    }
    pp_Var4 = pTVar3[1]._vptr_TypeBase;
    if ((pp_Var4 == (_func_int **)0x0) || (*(int *)(pp_Var4 + 1) != 0x13)) {
      pp_Var4 = (_func_int **)0x0;
    }
    if (pp_Var4 == (_func_int **)0x0) {
      __assert_fail("arrayType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xd0c,
                    "VmValue *CompileVmArrayIndex(ExpressionContext &, VmModule *, ExprArrayIndex *)"
                   );
    }
    if (*(int *)(pp_Var4[0xc] + 0x34) != 0) {
      __assert_fail("unsigned(arrayType->subType->size) == arrayType->subType->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xd0d,
                    "VmValue *CompileVmArrayIndex(ExpressionContext &, VmModule *, ExprArrayIndex *)"
                   );
    }
    pVVar1 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                               *(int *)(pp_Var4 + 0xd));
    elementSize = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                    *(int *)(pp_Var4[0xc] + 0x30));
    source = (node->super_ExprBase).source;
    pTVar2 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pp_Var4[0xc]);
    unaff_R12 = (VmInstruction *)
                anon_unknown.dwarf_233176::CreateIndex
                          (module,source,&pVVar1->super_VmValue,&elementSize->super_VmValue,first,
                           second,&pTVar2->super_TypeBase);
    anon_unknown.dwarf_233176::CheckType(ctx,&node->super_ExprBase,(VmValue *)unaff_R12);
  }
  return &unaff_R12->super_VmValue;
}

Assistant:

VmValue* CompileVmArrayIndex(ExpressionContext &ctx, VmModule *module, ExprArrayIndex *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);
	VmValue *index = CompileVm(ctx, module, node->index);

	if(TypeUnsizedArray *arrayType = getType<TypeUnsizedArray>(node->value->type))
	{
		VmValue *elementSize = CreateConstantInt(module->allocator, node->source, unsigned(arrayType->subType->size));

		return CheckType(ctx, node, CreateIndexUnsized(module, node->source, elementSize, value, index, ctx.GetReferenceType(arrayType->subType)));
	}

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);
	assert(unsigned(arrayType->subType->size) == arrayType->subType->size);

	VmValue *arrayLength = CreateConstantInt(module->allocator, node->source, unsigned(arrayType->length));
	VmValue *elementSize = CreateConstantInt(module->allocator, node->source, unsigned(arrayType->subType->size));

	return CheckType(ctx, node, CreateIndex(module, node->source, arrayLength, elementSize, value, index, ctx.GetReferenceType(arrayType->subType)));
}